

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O3

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                   string *validation_name,string *item_name,
                   vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                   *objects_info,XrBodyJointSetBD value)

{
  pointer pbVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *enabled_extension;
  pointer pbVar3;
  bool bVar4;
  string vuid;
  string error_str;
  string local_a0;
  string *local_80;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *local_78;
  string *local_70;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_68;
  string local_50;
  
  if (instance_info == (GenValidUsageXrInstanceInfo *)0x0) {
LAB_0014a4d9:
    bVar4 = value - XR_BODY_JOINT_SET_BODY_WITHOUT_ARM_BD < 2;
  }
  else {
    pbVar1 = (instance_info->enabled_extensions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_80 = command_name;
    local_70 = item_name;
    local_78 = objects_info;
    for (pbVar3 = (instance_info->enabled_extensions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1)
    {
      iVar2 = std::__cxx11::string::compare((char *)pbVar3);
      if (iVar2 == 0) goto LAB_0014a4d9;
    }
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"VUID-","");
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)(validation_name->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_a0);
    std::__cxx11::string::_M_append((char *)&local_a0,(ulong)(local_70->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)&local_a0);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"XrBodyJointSetBD requires extension ","");
    std::__cxx11::string::append((char *)&local_50);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_68,local_78);
    CoreValidLogMessage(instance_info,&local_a0,VALID_USAGE_DEBUG_SEVERITY_ERROR,local_80,&local_68,
                        &local_50);
    if (local_68.
        super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.
                      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool ValidateXrEnum(GenValidUsageXrInstanceInfo *instance_info,
                    const std::string &command_name,
                    const std::string &validation_name,
                    const std::string &item_name,
                    std::vector<GenValidUsageXrObjectInfo>& objects_info,
                    const XrBodyJointSetBD value) {
    (void)instance_info;  // quiet warnings
    (void)command_name;  // quiet warnings
    (void)validation_name;  // quiet warnings
    (void)item_name;  // quiet warnings
    (void)objects_info;  // quiet warnings
    // Enum requires extension XR_BD_body_tracking, so check that it is enabled
    if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_BD_body_tracking")) {
        std::string vuid = "VUID-";
        vuid += validation_name;
        vuid += "-";
        vuid += item_name;
        vuid += "-parameter";
        std::string error_str = "XrBodyJointSetBD requires extension ";
        error_str += " \"XR_BD_body_tracking\" to be enabled, but it is not enabled";
        CoreValidLogMessage(instance_info, vuid,
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, error_str);
        return false;
    }
    switch (value) {
        case XR_BODY_JOINT_SET_BODY_WITHOUT_ARM_BD:
            return true;
        case XR_BODY_JOINT_SET_FULL_BODY_JOINTS_BD:
            return true;
    default:
        return false;
}
}